

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O3

QLayoutItem * __thiscall
QBoxLayoutPrivate::replaceAt(QBoxLayoutPrivate *this,int index,QLayoutItem *item)

{
  QBoxLayoutItem *pQVar1;
  long *plVar2;
  QLayoutItem *pQVar3;
  
  if (((item != (QLayoutItem *)0x0) && ((ulong)(long)index < (ulong)(this->list).d.size)) &&
     (pQVar1 = (this->list).d.ptr[index], pQVar1 != (QBoxLayoutItem *)0x0)) {
    plVar2 = *(long **)&(this->super_QLayoutPrivate).field_0x8;
    pQVar3 = pQVar1->item;
    pQVar1->item = item;
    (**(code **)(*plVar2 + 0x70))();
    return pQVar3;
  }
  return (QLayoutItem *)0x0;
}

Assistant:

QLayoutItem* QBoxLayoutPrivate::replaceAt(int index, QLayoutItem *item)
{
    Q_Q(QBoxLayout);
    if (!item)
        return nullptr;
    QBoxLayoutItem *b = list.value(index);
    if (!b)
        return nullptr;
    QLayoutItem *r = b->item;

    b->item = item;
    q->invalidate();
    return r;
}